

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sortkey.cpp
# Opt level: O1

uint8_t * __thiscall
icu_63::CollationKey::reallocate(CollationKey *this,int32_t newCapacity,int32_t length)

{
  byte *pbVar1;
  uint8_t *__dest;
  StackBufferOrFields *__src;
  
  __dest = (uint8_t *)uprv_malloc_63((long)newCapacity);
  if (__dest == (uint8_t *)0x0) {
    __dest = (uint8_t *)0x0;
  }
  else {
    if (0 < length) {
      if (this->fFlagAndLength < 0) {
        __src = (StackBufferOrFields *)(this->fUnion).fFields.fBytes;
      }
      else {
        __src = &this->fUnion;
      }
      memcpy(__dest,__src,(ulong)(uint)length);
    }
    if (this->fFlagAndLength < 0) {
      uprv_free_63((this->fUnion).fFields.fBytes);
    }
    (this->fUnion).fFields.fBytes = __dest;
    (this->fUnion).fFields.fCapacity = newCapacity;
    pbVar1 = (byte *)((long)&this->fFlagAndLength + 3);
    *pbVar1 = *pbVar1 | 0x80;
  }
  return __dest;
}

Assistant:

uint8_t *CollationKey::reallocate(int32_t newCapacity, int32_t length) {
    uint8_t *newBytes = static_cast<uint8_t *>(uprv_malloc(newCapacity));
    if(newBytes == NULL) { return NULL; }
    if(length > 0) {
        uprv_memcpy(newBytes, getBytes(), length);
    }
    if(fFlagAndLength < 0) { uprv_free(fUnion.fFields.fBytes); }
    fUnion.fFields.fBytes = newBytes;
    fUnion.fFields.fCapacity = newCapacity;
    fFlagAndLength |= 0x80000000;
    return newBytes;
}